

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

string * __thiscall
Function::getXInputName_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->eType == INPUT_X) {
    std::operator+(&local_38,&this->sName,", ");
    Unit::getName_abi_cxx11_(&local_58,&(this->super_Physical).physicalUnit);
    std::operator+(&bStack_78,&local_38,&local_58);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_78);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if (this->xLeft != (Function *)0x0) {
    getXInputName_abi_cxx11_(&bStack_78,this->xLeft);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_78);
    std::__cxx11::string::~string((string *)&bStack_78);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if (this->xRight != (Function *)0x0) {
    getXInputName_abi_cxx11_(&bStack_78,this->xRight);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_78);
    std::__cxx11::string::~string((string *)&bStack_78);
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  }
  if (this->xPlus != (Function *)0x0) {
    getXInputName_abi_cxx11_(&bStack_78,this->xPlus);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_78);
    std::__cxx11::string::~string((string *)&bStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string Function::getXInputName()
{
	string name;
	if (eType == INPUT_X)
		name = sName + ", " + physicalUnit.getName();
	if (!name.length() && xLeft)
		name = xLeft->getXInputName();
	if (!name.length() && xRight)
		name = xRight->getXInputName();
	if (!name.length() && xPlus)
		name = xPlus->getXInputName();
	return name;
}